

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::Event> * __thiscall
kj::Own<kj::_::Event>::operator=(Own<kj::_::Event> *this,Own<kj::_::Event> *other)

{
  Disposer *this_00;
  Event *object;
  Event *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::_::Event> *other_local;
  Own<kj::_::Event> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (Event *)0x0;
  if (object != (Event *)0x0) {
    Disposer::dispose<kj::_::Event>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }